

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcssparser.cpp
# Opt level: O3

bool __thiscall
QCss::ValueExtractor::extractImage(ValueExtractor *this,QIcon *icon,Alignment *a,QSize *size)

{
  int iVar1;
  Declaration *pDVar2;
  DeclarationData *pDVar3;
  Data *pDVar4;
  Alignment AVar5;
  QSize QVar6;
  void *__buf;
  bool bVar7;
  Declaration *this_00;
  ulong uVar8;
  long lVar9;
  long in_FS_OFFSET;
  QImageReader imageReader;
  QByteArray local_78;
  QImage local_58;
  QImageReader local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((this->declarations).d.size == 0) {
    bVar7 = false;
  }
  else {
    lVar9 = 0;
    uVar8 = 0;
    bVar7 = false;
    do {
      pDVar2 = (this->declarations).d.ptr;
      this_00 = (Declaration *)((long)&(pDVar2->d).d.ptr + lVar9);
      iVar1 = *(int *)(*(long *)((long)&(pDVar2->d).d.ptr + lVar9) + 0x20);
      if (iVar1 == 0x57) {
        AVar5 = Declaration::alignmentValue(this_00);
        (a->super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>).super_QFlagsStorage<Qt::AlignmentFlag>.
        i = (Int)AVar5;
        bVar7 = true;
      }
      else if (iVar1 == 0x4b) {
        Declaration::iconValue((Declaration *)&local_78);
        pDVar4 = local_78.d.d;
        local_78.d.d = (Data *)0x0;
        local_58.super_QPaintDevice._vptr_QPaintDevice = (_func_int **)icon->d;
        icon->d = (QIconPrivate *)pDVar4;
        QIcon::~QIcon((QIcon *)&local_58);
        QIcon::~QIcon((QIcon *)&local_78);
        pDVar3 = (this_00->d).d.ptr;
        bVar7 = true;
        if (((pDVar3->values).d.size != 0) && (((pDVar3->values).d.ptr)->type == Uri)) {
          local_40.d = (QImageReaderPrivate *)&DAT_aaaaaaaaaaaaaaaa;
          ::QVariant::toString();
          local_78.d.d = (Data *)0x0;
          local_78.d.ptr = (char *)0x0;
          local_78.d.size = 0;
          QImageReader::QImageReader(&local_40,(QString *)&local_58,&local_78);
          if ((QIconPrivate *)local_78.d.d != (QIconPrivate *)0x0) {
            LOCK();
            *(int *)&(local_78.d.d)->super_QArrayData =
                 *(int *)&(local_78.d.d)->super_QArrayData + -1;
            UNLOCK();
            if (*(int *)&(local_78.d.d)->super_QArrayData == 0) {
              QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,1,0x10);
            }
          }
          if ((QIconPrivate *)local_58.super_QPaintDevice._vptr_QPaintDevice != (QIconPrivate *)0x0)
          {
            LOCK();
            *(int *)(QIconEngine **)local_58.super_QPaintDevice._vptr_QPaintDevice =
                 *(int *)(QIconEngine **)local_58.super_QPaintDevice._vptr_QPaintDevice + -1;
            UNLOCK();
            if (*(int *)(QIconEngine **)local_58.super_QPaintDevice._vptr_QPaintDevice == 0) {
              QArrayData::deallocate
                        ((QArrayData *)local_58.super_QPaintDevice._vptr_QPaintDevice,2,0x10);
            }
          }
          QVar6 = QImageReader::size(&local_40);
          *size = QVar6;
          if (QVar6 == (QSize)0x0) {
            QImageReader::read((QImageReader *)&local_58,(int)&local_40,__buf,(size_t)size);
            QVar6 = QImage::size(&local_58);
            *size = QVar6;
            QImage::~QImage(&local_58);
          }
          QImageReader::~QImageReader(&local_40);
        }
      }
      uVar8 = uVar8 + 1;
      lVar9 = lVar9 + 8;
    } while (uVar8 < (ulong)(this->declarations).d.size);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return bVar7;
}

Assistant:

bool ValueExtractor::extractImage(QIcon *icon, Qt::Alignment *a, QSize *size)
{
    bool hit = false;
    for (int i = 0; i < declarations.size(); ++i) {
        const Declaration &decl = declarations.at(i);
        switch (decl.d->propertyId) {
        case QtImage:
            *icon = decl.iconValue();
            if (decl.d->values.size() > 0 && decl.d->values.at(0).type == Value::Uri) {
                // try to pull just the size from the image...
                QImageReader imageReader(decl.d->values.at(0).variant.toString());
                if ((*size = imageReader.size()).isNull()) {
                    // but we'll have to load the whole image if the
                    // format doesn't support just reading the size
                    *size = imageReader.read().size();
                }
            }
            break;
        case QtImageAlignment: *a = decl.alignmentValue();  break;
        default: continue;
        }
        hit = true;
    }
    return hit;
}